

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-attack-munchkin.c
# Opt level: O0

_Bool borg_munchkin_melee(void)

{
  int iVar1;
  loc grid1;
  wchar_t wVar2;
  borg_kill *pbVar3;
  char *what;
  borg_kill *kill;
  borg_grid *ag;
  int local_10;
  int n;
  int i;
  
  if ((borg.trait[0x19] == 1) || (borg.trait[0x19] == 4)) {
    n._3_1_ = false;
  }
  else if ((borg_grids[borg.c.y][borg.c.x].feat == '\x06') ||
          (borg_grids[borg.c.y][borg.c.x].feat == '\x05')) {
    if (borg_kills_cnt == 0) {
      n._3_1_ = false;
    }
    else {
      wVar2 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,true);
      if (((avoidance * 7) / 10 < wVar2) || (borg.trait[0x1b] < borg.trait[0x1c] / 3)) {
        n._3_1_ = false;
      }
      else if (borg.trait[0x72] == 0) {
        borg_attacking = true;
        borg_temp_n = 0;
        for (local_10 = 1; local_10 < borg_kills_nxt; local_10 = local_10 + 1) {
          pbVar3 = borg_kills + local_10;
          if (((pbVar3->r_idx != 0) && (borg_t + -2 <= (int)pbVar3->when)) &&
             (borg.trait[0x69] != 0)) {
            if ((scaryguy_on_level & 1U) != 0) {
              return false;
            }
            iVar1 = (pbVar3->pos).x;
            if ((((borg_grids[(pbVar3->pos).y][iVar1].info & 8) != 0) &&
                ((borg_grids[(pbVar3->pos).y][iVar1].info & 0x20) != 0)) &&
               (grid1.y = borg.c.y, grid1.x = borg.c.x, wVar2 = distance(grid1,pbVar3->pos),
               wVar2 == L'\x01')) {
              borg_temp_x[borg_temp_n] = (uint8_t)(pbVar3->pos).x;
              borg_temp_y[borg_temp_n] = (uint8_t)(pbVar3->pos).y;
              borg_temp_n = borg_temp_n + 1;
            }
          }
        }
        if (borg_temp_n == 0) {
          borg_attacking = false;
          n._3_1_ = false;
        }
        else {
          borg_simulate = true;
          wVar2 = borg_calculate_attack_effectiveness(L'\x01');
          if (wVar2 < L'\x01') {
            borg_attacking = false;
            n._3_1_ = false;
          }
          else {
            what = format("# Performing munchkin attack with value %d.",(ulong)(uint)wVar2);
            borg_note(what);
            borg_simulate = false;
            borg_calculate_attack_effectiveness(L'\x01');
            borg_attacking = false;
            n._3_1_ = true;
          }
        }
      }
      else {
        n._3_1_ = false;
      }
    }
  }
  else {
    n._3_1_ = false;
  }
  return n._3_1_;
}

Assistant:

bool borg_munchkin_melee(void)
{
    int i;
    int n = 0;

    borg_grid *ag;

    /* No Mages for now */
    if ((borg.trait[BI_CLASS] == CLASS_MAGE
            || borg.trait[BI_CLASS] == CLASS_NECROMANCER))
        return false;

    /* Must be standing on a stair */
    if (borg_grids[borg.c.y][borg.c.x].feat != FEAT_MORE
        && borg_grids[borg.c.y][borg.c.x].feat != FEAT_LESS)
        return false;

    /* Nobody around */
    if (!borg_kills_cnt)
        return false;

    /* Not if too dangerous */
    if ((borg_danger(borg.c.y, borg.c.x, 1, true, true) > avoidance * 7 / 10)
        || borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 3)
        return false;
    if (borg.trait[BI_ISCONFUSED])
        return false;

    /* Set the attacking flag so that danger is boosted for monsters */
    /* we want to attack first. */
    borg_attacking = true;

    /* Reset list */
    borg_temp_n = 0;

    /* Find "nearby" monsters */
    for (i = 1; i < borg_kills_nxt; i++) {
        borg_kill *kill;

        /* Monster */
        kill = &borg_kills[i];

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* Require current knowledge */
        if (kill->when < borg_t - 2)
            continue;

        /* Not in town.  This should not be reached, but just in case we add it
         */
        if (borg.trait[BI_CDEPTH] == 0)
            continue;

        /* no attacking most scaryguys, try to get off the level */
        if (scaryguy_on_level)
            return false;

        /* Get grid */
        ag = &borg_grids[kill->pos.y][kill->pos.x];

        /* Never shoot off-screen */
        if (!(ag->info & BORG_OKAY))
            continue;

        /* Never shoot through walls */
        if (!(ag->info & BORG_VIEW))
            continue;

        /* Check the distance XXX XXX XXX */
        if (distance(borg.c, kill->pos) != 1)
            continue;

        /* Save the location (careful) */
        borg_temp_x[borg_temp_n] = kill->pos.x;
        borg_temp_y[borg_temp_n] = kill->pos.y;
        borg_temp_n++;
    }

    /* No destinations */
    if (!borg_temp_n) {
        borg_attacking = false;
        return false;
    }

    /* Simulate */
    borg_simulate = true;

    /* Simulated */
    n = borg_calculate_attack_effectiveness(BF_THRUST);

    /* Nothing good */
    if (n <= 0) {
        borg_attacking = false;
        return false;
    }

    /* Note */
    borg_note(format("# Performing munchkin attack with value %d.", n));

    /* Instantiate */
    borg_simulate = false;

    /* Instantiate */
    (void)borg_calculate_attack_effectiveness(BF_THRUST);

    borg_attacking = false;

    /* Success */
    return true;
}